

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::FatalConditionHandler::FatalConditionHandler(FatalConditionHandler *this)

{
  ulong __n;
  unsigned_long *puVar1;
  void *__s;
  unsigned_long local_18;
  FatalConditionHandler *local_10;
  FatalConditionHandler *this_local;
  
  this->m_started = false;
  local_10 = this;
  if (altStackMem != (void *)0x0) {
    __assert_fail("!altStackMem && \"Cannot initialize POSIX signal handler when one already exists\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0xfb6,"Catch::FatalConditionHandler::FatalConditionHandler()");
  }
  if (altStackSize == 0) {
    local_18 = sysconf(0xfa);
    puVar1 = std::max<unsigned_long>(&local_18,&::(anonymous_namespace)::minStackSizeForErrors);
    altStackSize = *puVar1;
  }
  __n = altStackSize;
  __s = operator_new__(altStackSize);
  memset(__s,0,__n);
  altStackMem = __s;
  return;
}

Assistant:

FatalConditionHandler::FatalConditionHandler() {
        assert(!altStackMem && "Cannot initialize POSIX signal handler when one already exists");
        if (altStackSize == 0) {
            altStackSize = std::max(static_cast<size_t>(SIGSTKSZ), minStackSizeForErrors);
        }
        altStackMem = new char[altStackSize]();
    }